

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetFileClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,FileDescriptor *file,
          bool immutable,bool kotlin)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  undefined7 in_register_00000081;
  string local_30;
  
  if ((int)CONCAT71(in_register_00000081,kotlin) == 0) {
    if (immutable) {
      GetFileImmutableClassName_abi_cxx11_(__return_storage_ptr__,this,file);
      return __return_storage_ptr__;
    }
    GetFileImmutableClassName_abi_cxx11_(&local_30,this,file);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_30,0,(char *)0x0,0x4163d7);
  }
  else {
    GetFileImmutableClassName_abi_cxx11_(&local_30,this,file);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_30);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetFileClassName(const FileDescriptor* file,
                                                bool immutable, bool kotlin) {
  if (kotlin) {
    return GetFileImmutableClassName(file) + "Kt";
  } else if (immutable) {
    return GetFileImmutableClassName(file);
  } else {
    return "Mutable" + GetFileImmutableClassName(file);
  }
}